

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::IncorrectTagValue::IncorrectTagValue(IncorrectTagValue *this,int field,string *what)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *what_local;
  IncorrectTagValue *pIStack_10;
  int field_local;
  IncorrectTagValue *this_local;
  
  local_20 = what;
  what_local._4_4_ = field;
  pIStack_10 = this;
  std::__cxx11::to_string(&local_60,field);
  std::operator+(&local_40,"Value is incorrect (out of range) for this tag: ",&local_60);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)&this->super_Exception = &PTR__IncorrectTagValue_0032f880;
  this->field = what_local._4_4_;
  return;
}

Assistant:

IncorrectTagValue(int field = 0, const std::string &what = "")
      : Exception("Value is incorrect (out of range) for this tag: " + std::to_string(field), what),
        field(field) {}